

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_insn_code_t MIR_reverse_branch_code(MIR_insn_code_t code)

{
  MIR_insn_code_t MVar1;
  
  MVar1 = MIR_INSN_BOUND;
  if (code - MIR_BT < 0x42) {
    MVar1 = *(MIR_insn_code_t *)(&DAT_00179a80 + (ulong)(code - MIR_BT) * 4);
  }
  return MVar1;
}

Assistant:

MIR_insn_code_t MIR_reverse_branch_code (MIR_insn_code_t code) {
  switch (code) {
  case MIR_BT: return MIR_BF;
  case MIR_BTS: return MIR_BFS;
  case MIR_BF: return MIR_BT;
  case MIR_BFS: return MIR_BTS;
  case MIR_BEQ: return MIR_BNE;
  case MIR_BEQS: return MIR_BNES;
  case MIR_BNE: return MIR_BEQ;
  case MIR_BNES: return MIR_BEQS;
  case MIR_BLT: return MIR_BGE;
  case MIR_BLTS: return MIR_BGES;
  case MIR_UBLT: return MIR_UBGE;
  case MIR_UBLTS: return MIR_UBGES;
  case MIR_BLE: return MIR_BGT;
  case MIR_BLES: return MIR_BGTS;
  case MIR_UBLE: return MIR_UBGT;
  case MIR_UBLES: return MIR_UBGTS;
  case MIR_BGT: return MIR_BLE;
  case MIR_BGTS: return MIR_BLES;
  case MIR_UBGT: return MIR_UBLE;
  case MIR_UBGTS: return MIR_UBLES;
  case MIR_BGE: return MIR_BLT;
  case MIR_BGES: return MIR_BLTS;
  case MIR_UBGE: return MIR_UBLT;
  case MIR_UBGES: return MIR_UBLTS;
  case MIR_BO: return MIR_BNO;
  case MIR_UBO: return MIR_UBNO;
  case MIR_BNO: return MIR_BO;
  case MIR_UBNO: return MIR_UBO;
  case MIR_PRBEQ: return MIR_PRBNE;
  case MIR_PRBNE: return MIR_PRBEQ;
  default: return MIR_INSN_BOUND;
  }
}